

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block_internal.h
# Opt level: O2

void __thiscall cfd::core::MerkleBlock::~MerkleBlock(MerkleBlock *this)

{
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::~vector(&this->txids_);
  ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->bits_).super__Bvector_base<std::allocator<bool>_>);
  return;
}

Assistant:

class CFD_CORE_EXPORT MerkleBlock {
 public:
  /**
   * @brief constructor.
   * @param[in] block   block object.
   * @param[in] txids   target txid list.
   */
  MerkleBlock(const Block& block, const std::vector<Txid>& txids);

  /**
   * @brief get serialize data.
   * @return serialized data.
   */
  ByteData Serialize() const;

 private:
  uint64_t transaction_count;  //!< total number of transactions
  std::vector<bool> bits_;     //!< node-is-parent-of-matched-txid bits
  std::vector<Txid> txids_;    //!< transaction id list

  /**
   * @brief Traverse and build.
   * @param[in] height      height
   * @param[in] pos         position
   * @param[in] txids       txid list
   * @param[in] matches     target match list
   */
  void TraverseAndBuild(
      uint64_t height, uint64_t pos, const std::vector<Txid>& txids,
      const std::vector<bool> matches);

  /**
   * @brief calculate hash.
   * @param[in] height      height
   * @param[in] pos         position
   * @param[in] txids       txid list
   * @return hash (txid)
   */
  Txid CalculateHash(
      uint64_t height, uint64_t pos, const std::vector<Txid>& txids);
}